

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityPrintNumber(UNITY_INT number_to_print)

{
  undefined8 local_18;
  UNITY_UINT number;
  UNITY_INT number_to_print_local;
  
  local_18 = number_to_print;
  if (number_to_print < 0) {
    putchar(0x2d);
    local_18 = -number_to_print;
  }
  UnityPrintNumberUnsigned(local_18);
  return;
}

Assistant:

void UnityPrintNumber(const UNITY_INT number_to_print)
{
    UNITY_UINT number = (UNITY_UINT)number_to_print;

    if (number_to_print < 0)
    {
        /* A negative number, including MIN negative */
        UNITY_OUTPUT_CHAR('-');
        number = (UNITY_UINT)(-number_to_print);
    }
    UnityPrintNumberUnsigned(number);
}